

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::
     deleteAll<std::vector<Catch::IExceptionTranslator_const*,std::allocator<Catch::IExceptionTranslator_const*>>>
               (vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
                *container)

{
  bool bVar1;
  reference ppIVar2;
  __normal_iterator<const_Catch::IExceptionTranslator_**,_std::vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>_>
  local_30;
  __normal_iterator<const_Catch::IExceptionTranslator_*const_*,_std::vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>_>
  local_28;
  const_iterator itEnd;
  __normal_iterator<const_Catch::IExceptionTranslator_*const_*,_std::vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>_>
  local_18;
  const_iterator it;
  vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
  *container_local;
  
  it._M_current = (IExceptionTranslator **)container;
  itEnd._M_current =
       (IExceptionTranslator **)
       std::
       vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
       ::begin(container);
  __gnu_cxx::
  __normal_iterator<Catch::IExceptionTranslator_const*const*,std::vector<Catch::IExceptionTranslator_const*,std::allocator<Catch::IExceptionTranslator_const*>>>
  ::__normal_iterator<Catch::IExceptionTranslator_const**>
            ((__normal_iterator<Catch::IExceptionTranslator_const*const*,std::vector<Catch::IExceptionTranslator_const*,std::allocator<Catch::IExceptionTranslator_const*>>>
              *)&local_18,
             (__normal_iterator<const_Catch::IExceptionTranslator_**,_std::vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>_>
              *)&itEnd);
  local_30._M_current =
       (IExceptionTranslator **)
       std::
       vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
       ::end(it._M_current);
  __gnu_cxx::
  __normal_iterator<Catch::IExceptionTranslator_const*const*,std::vector<Catch::IExceptionTranslator_const*,std::allocator<Catch::IExceptionTranslator_const*>>>
  ::__normal_iterator<Catch::IExceptionTranslator_const**>
            ((__normal_iterator<Catch::IExceptionTranslator_const*const*,std::vector<Catch::IExceptionTranslator_const*,std::allocator<Catch::IExceptionTranslator_const*>>>
              *)&local_28,&local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<const_Catch::IExceptionTranslator_*const_*,_std::vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>_>
              ::operator*(&local_18);
    if (*ppIVar2 != (IExceptionTranslator *)0x0) {
      (*(*ppIVar2)->_vptr_IExceptionTranslator[1])();
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::IExceptionTranslator_*const_*,_std::vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

inline void deleteAll( ContainerT& container ) {
        typename ContainerT::const_iterator it = container.begin();
        typename ContainerT::const_iterator itEnd = container.end();
        for(; it != itEnd; ++it )
            delete *it;
    }